

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

int str2mc(char *s)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = strcmp(s,"1.21");
  uVar2 = 0x1c;
  if (iVar1 != 0) {
    iVar1 = strcmp(s,"1.21 WD");
    if (iVar1 != 0) {
      iVar1 = strcmp(s,"1.21.3");
      uVar2 = 0x1b;
      if (iVar1 != 0) {
        iVar1 = strcmp(s,"1.21.2");
        if (iVar1 != 0) {
          iVar1 = strcmp(s,"1.21.1");
          if (iVar1 == 0) {
            uVar2 = 0x1a;
          }
          else {
            iVar1 = strcmp(s,"1.20");
            uVar2 = 0x19;
            if (iVar1 != 0) {
              iVar1 = strcmp(s,"1.20.6");
              if (iVar1 != 0) {
                iVar1 = strcmp(s,"1.19");
                uVar2 = 0x18;
                if (iVar1 != 0) {
                  iVar1 = strcmp(s,"1.19.4");
                  if (iVar1 != 0) {
                    iVar1 = strcmp(s,"1.19.2");
                    if (iVar1 == 0) {
                      uVar2 = 0x17;
                    }
                    else {
                      iVar1 = strcmp(s,"1.18");
                      uVar2 = 0x16;
                      if (iVar1 != 0) {
                        iVar1 = strcmp(s,"1.18.2");
                        if (iVar1 != 0) {
                          iVar1 = strcmp(s,"1.17");
                          uVar2 = 0x15;
                          if (iVar1 != 0) {
                            iVar1 = strcmp(s,"1.17.1");
                            if (iVar1 != 0) {
                              iVar1 = strcmp(s,"1.16");
                              uVar2 = 0x14;
                              if (iVar1 != 0) {
                                iVar1 = strcmp(s,"1.16.5");
                                if (iVar1 != 0) {
                                  iVar1 = strcmp(s,"1.16.1");
                                  if (iVar1 == 0) {
                                    uVar2 = 0x13;
                                  }
                                  else {
                                    iVar1 = strcmp(s,"1.15");
                                    uVar2 = 0x12;
                                    if (iVar1 != 0) {
                                      iVar1 = strcmp(s,"1.15.2");
                                      if (iVar1 != 0) {
                                        iVar1 = strcmp(s,"1.14");
                                        uVar2 = 0x11;
                                        if (iVar1 != 0) {
                                          iVar1 = strcmp(s,"1.14.4");
                                          if (iVar1 != 0) {
                                            iVar1 = strcmp(s,"1.13");
                                            uVar2 = 0x10;
                                            if (iVar1 != 0) {
                                              iVar1 = strcmp(s,"1.13.2");
                                              if (iVar1 != 0) {
                                                iVar1 = strcmp(s,"1.12");
                                                uVar2 = 0xf;
                                                if (iVar1 != 0) {
                                                  iVar1 = strcmp(s,"1.12.2");
                                                  if (iVar1 != 0) {
                                                    iVar1 = strcmp(s,"1.11");
                                                    uVar2 = 0xe;
                                                    if (iVar1 != 0) {
                                                      iVar1 = strcmp(s,"1.11.2");
                                                      if (iVar1 != 0) {
                                                        iVar1 = strcmp(s,"1.10");
                                                        uVar2 = 0xd;
                                                        if (iVar1 != 0) {
                                                          iVar1 = strcmp(s,"1.10.2");
                                                          if (iVar1 != 0) {
                                                            iVar1 = strcmp(s,"1.9");
                                                            uVar2 = 0xc;
                                                            if (iVar1 != 0) {
                                                              iVar1 = strcmp(s,"1.9.4");
                                                              if (iVar1 != 0) {
                                                                iVar1 = strcmp(s,"1.8");
                                                                uVar2 = 0xb;
                                                                if (iVar1 != 0) {
                                                                  iVar1 = strcmp(s,"1.8.9");
                                                                  if (iVar1 != 0) {
                                                                    iVar1 = strcmp(s,"1.7");
                                                                    uVar2 = 10;
                                                                    if (iVar1 != 0) {
                                                                      iVar1 = strcmp(s,"1.7.10");
                                                                      if (iVar1 != 0) {
                                                                        iVar1 = strcmp(s,"1.6");
                                                                        uVar2 = 9;
                                                                        if (iVar1 != 0) {
                                                                          iVar1 = strcmp(s,"1.6.4");
                                                                          if (iVar1 != 0) {
                                                                            iVar1 = strcmp(s,"1.5");
                                                                            uVar2 = 8;
                                                                            if (iVar1 != 0) {
                                                                              iVar1 = strcmp(s,
                                                  "1.5.2");
                                                  if (iVar1 != 0) {
                                                    iVar1 = strcmp(s,"1.4");
                                                    uVar2 = 7;
                                                    if (iVar1 != 0) {
                                                      iVar1 = strcmp(s,"1.4.7");
                                                      if (iVar1 != 0) {
                                                        iVar1 = strcmp(s,"1.3");
                                                        uVar2 = 6;
                                                        if (iVar1 != 0) {
                                                          iVar1 = strcmp(s,"1.3.2");
                                                          if (iVar1 != 0) {
                                                            iVar1 = strcmp(s,"1.2");
                                                            uVar2 = 5;
                                                            if (iVar1 != 0) {
                                                              iVar1 = strcmp(s,"1.2.5");
                                                              if (iVar1 != 0) {
                                                                iVar1 = strcmp(s,"1.1");
                                                                uVar2 = 4;
                                                                if (iVar1 != 0) {
                                                                  iVar1 = strcmp(s,"1.1.0");
                                                                  if (iVar1 != 0) {
                                                                    iVar1 = strcmp(s,"1.0");
                                                                    uVar2 = 3;
                                                                    if (iVar1 != 0) {
                                                                      iVar1 = strcmp(s,"1.0.0");
                                                                      if (iVar1 != 0) {
                                                                        iVar1 = strcmp(s,"Beta 1.8")
                                                                        ;
                                                                        if (iVar1 == 0) {
                                                                          uVar2 = 2;
                                                                        }
                                                                        else {
                                                                          iVar1 = strcmp(s,
                                                  "Beta 1.7");
                                                  uVar2 = (uint)(iVar1 == 0);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return uVar2;
}

Assistant:

int str2mc(const char *s)
{
    if (!strcmp(s, "1.21"))     return MC_1_21;
    if (!strcmp(s, "1.21 WD"))  return MC_1_21_WD;
    if (!strcmp(s, "1.21.3"))   return MC_1_21_3;
    if (!strcmp(s, "1.21.2"))   return MC_1_21_3; // backwards compatibility
    if (!strcmp(s, "1.21.1"))   return MC_1_21_1;
    if (!strcmp(s, "1.20"))     return MC_1_20;
    if (!strcmp(s, "1.20.6"))   return MC_1_20_6;
    if (!strcmp(s, "1.19"))     return MC_1_19;
    if (!strcmp(s, "1.19.4"))   return MC_1_19_4;
    if (!strcmp(s, "1.19.2"))   return MC_1_19_2;
    if (!strcmp(s, "1.18"))     return MC_1_18;
    if (!strcmp(s, "1.18.2"))   return MC_1_18_2;
    if (!strcmp(s, "1.17"))     return MC_1_17;
    if (!strcmp(s, "1.17.1"))   return MC_1_17_1;
    if (!strcmp(s, "1.16"))     return MC_1_16;
    if (!strcmp(s, "1.16.5"))   return MC_1_16_5;
    if (!strcmp(s, "1.16.1"))   return MC_1_16_1;
    if (!strcmp(s, "1.15"))     return MC_1_15;
    if (!strcmp(s, "1.15.2"))   return MC_1_15_2;
    if (!strcmp(s, "1.14"))     return MC_1_14;
    if (!strcmp(s, "1.14.4"))   return MC_1_14_4;
    if (!strcmp(s, "1.13"))     return MC_1_13;
    if (!strcmp(s, "1.13.2"))   return MC_1_13_2;
    if (!strcmp(s, "1.12"))     return MC_1_12;
    if (!strcmp(s, "1.12.2"))   return MC_1_12_2;
    if (!strcmp(s, "1.11"))     return MC_1_11;
    if (!strcmp(s, "1.11.2"))   return MC_1_11_2;
    if (!strcmp(s, "1.10"))     return MC_1_10;
    if (!strcmp(s, "1.10.2"))   return MC_1_10_2;
    if (!strcmp(s, "1.9"))      return MC_1_9;
    if (!strcmp(s, "1.9.4"))    return MC_1_9_4;
    if (!strcmp(s, "1.8"))      return MC_1_8;
    if (!strcmp(s, "1.8.9"))    return MC_1_8_9;
    if (!strcmp(s, "1.7"))      return MC_1_7;
    if (!strcmp(s, "1.7.10"))   return MC_1_7_10;
    if (!strcmp(s, "1.6"))      return MC_1_6;
    if (!strcmp(s, "1.6.4"))    return MC_1_6_4;
    if (!strcmp(s, "1.5"))      return MC_1_5;
    if (!strcmp(s, "1.5.2"))    return MC_1_5_2;
    if (!strcmp(s, "1.4"))      return MC_1_4;
    if (!strcmp(s, "1.4.7"))    return MC_1_4_7;
    if (!strcmp(s, "1.3"))      return MC_1_3;
    if (!strcmp(s, "1.3.2"))    return MC_1_3_2;
    if (!strcmp(s, "1.2"))      return MC_1_2;
    if (!strcmp(s, "1.2.5"))    return MC_1_2_5;
    if (!strcmp(s, "1.1"))      return MC_1_1;
    if (!strcmp(s, "1.1.0"))    return MC_1_1_0;
    if (!strcmp(s, "1.0"))      return MC_1_0;
    if (!strcmp(s, "1.0.0"))    return MC_1_0_0;
    if (!strcmp(s, "Beta 1.8")) return MC_B1_8;
    if (!strcmp(s, "Beta 1.7")) return MC_B1_7;
    return MC_UNDEF;
}